

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O3

void duckdb::RLEScanPartialInternal<duckdb::uhugeint_t,true>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  data_ptr_t pdVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  RLEScanState<duckdb::uhugeint_t> *scan_state;
  uint64_t *puVar4;
  idx_t iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t iVar9;
  uhugeint_t *data_pointer;
  rle_count_t *index_pointer;
  ulong uVar10;
  uhugeint_t element;
  
  scan_state = (RLEScanState<duckdb::uhugeint_t> *)
               unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
               ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(scan_state->handle).node);
  pdVar1 = ((scan_state->handle).node.ptr)->buffer;
  data_pointer = (uhugeint_t *)(pdVar1 + segment->offset + 8);
  index_pointer = (rle_count_t *)(pdVar1 + (ulong)scan_state->rle_count_offset + segment->offset);
  if ((scan_count == 0x800) &&
     (0x7ff < (ulong)index_pointer[scan_state->entry_pos] - scan_state->position_in_entry)) {
    RLEScanConstant<duckdb::uhugeint_t>(scan_state,index_pointer,data_pointer,0x800,result);
    return;
  }
  pdVar1 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  uVar10 = scan_count + result_offset;
  if (result_offset < uVar10) {
    iVar5 = scan_state->entry_pos;
    iVar9 = scan_state->position_in_entry;
    do {
      uVar8 = index_pointer[iVar5] - iVar9;
      uVar7 = uVar10 - result_offset;
      uVar2 = data_pointer[iVar5].lower;
      uVar3 = data_pointer[iVar5].upper;
      if (uVar7 < uVar8) {
        if (uVar10 != result_offset) {
          puVar4 = (uint64_t *)(pdVar1 + result_offset * 0x10);
          lVar6 = uVar7 + (uVar7 == 0);
          do {
            *puVar4 = uVar2;
            puVar4[1] = uVar3;
            puVar4 = puVar4 + 2;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
          iVar9 = scan_state->position_in_entry;
        }
        scan_state->position_in_entry = iVar9 + uVar7;
        return;
      }
      if (index_pointer[iVar5] != iVar9) {
        puVar4 = (uint64_t *)(pdVar1 + result_offset * 0x10);
        uVar7 = uVar8;
        do {
          *puVar4 = uVar2;
          puVar4[1] = uVar3;
          puVar4 = puVar4 + 2;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
        iVar5 = scan_state->entry_pos;
      }
      result_offset = result_offset + uVar8;
      iVar5 = iVar5 + 1;
      scan_state->entry_pos = iVar5;
      scan_state->position_in_entry = 0;
      iVar9 = 0;
    } while (result_offset < uVar10);
  }
  return;
}

Assistant:

void RLEScanPartialInternal(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                            idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run
	if (CanEmitConstantVector<ENTIRE_VECTOR>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos],
	                                         scan_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, scan_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t result_end = result_offset + scan_count;
	while (result_offset < result_end) {
		rle_count_t run_end = index_pointer[scan_state.entry_pos];
		idx_t run_count = run_end - scan_state.position_in_entry;
		idx_t remaining_scan_count = result_end - result_offset;
		T element = data_pointer[scan_state.entry_pos];
		if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
			for (idx_t i = 0; i < remaining_scan_count; i++) {
				result_data[result_offset + i] = element;
			}
			scan_state.position_in_entry += remaining_scan_count;
			break;
		}

		for (idx_t i = 0; i < run_count; i++) {
			result_data[result_offset + i] = element;
		}

		result_offset += run_count;
		scan_state.ForwardToNextRun();
	}
}